

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

BaseRefVectorOf<char16_t> *
xercesc_4_0::XMLString::tokenizeString(XMLCh *tokenizeSrc,MemoryManager *manager)

{
  short *psVar1;
  XMLSize_t XVar2;
  int iVar3;
  XMLSize_t index;
  undefined4 extraout_var;
  BaseRefVectorOf<char16_t> *this;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  ulong startIndex;
  ulong srcStrLength;
  ulong endIndex;
  ulong uVar5;
  size_t __n;
  ArrayJanitor<char16_t> janText;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  
  if (tokenizeSrc == (XMLCh *)0x0) {
    toDelete = (char16_t *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)tokenizeSrc + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var,iVar3);
    memcpy(toDelete,tokenizeSrc,__n);
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,manager);
  this = (BaseRefVectorOf<char16_t> *)XMemory::operator_new(0x30,manager);
  this->_vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0040c1a0;
  this->fAdoptedElems = true;
  this->fCurCount = 0;
  this->fMaxCount = 0x10;
  this->fElemList = (char16_t **)0x0;
  this->fMemoryManager = manager;
  iVar3 = (*manager->_vptr_MemoryManager[3])(manager,0x80);
  this->fElemList = (char16_t **)CONCAT44(extraout_var_00,iVar3);
  lVar4 = 0;
  do {
    this->fElemList[lVar4] = (char16_t *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  this->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefArrayVectorOf_0040c128;
  if (toDelete == (char16_t *)0x0) {
    srcStrLength = 0;
  }
  else {
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)toDelete + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    srcStrLength = (lVar4 >> 1) - 1;
  }
  if (srcStrLength != 0) {
    endIndex = 0;
    do {
      startIndex = endIndex;
      if (endIndex < srcStrLength) {
        do {
          startIndex = endIndex;
          if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toDelete[endIndex]]) break;
          endIndex = endIndex + 1;
          startIndex = srcStrLength;
        } while (srcStrLength != endIndex);
      }
      endIndex = startIndex;
      uVar5 = startIndex;
      if (startIndex < srcStrLength) {
        do {
          endIndex = uVar5;
          if ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toDelete[uVar5]] < '\0') break;
          uVar5 = uVar5 + 1;
          endIndex = srcStrLength;
        } while (srcStrLength != uVar5);
      }
      if (endIndex - startIndex == 0) break;
      iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(endIndex - startIndex) * 2 + 2);
      subString((XMLCh *)CONCAT44(extraout_var_01,iVar3),toDelete,startIndex,endIndex,srcStrLength,
                manager);
      BaseRefVectorOf<char16_t>::ensureExtraCapacity(this,1);
      XVar2 = this->fCurCount;
      this->fElemList[XVar2] = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
      this->fCurCount = XVar2 + 1;
    } while (endIndex != srcStrLength);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return this;
}

Assistant:

BaseRefVectorOf<XMLCh>* XMLString::tokenizeString(const XMLCh*      const   tokenizeSrc
                                               ,  MemoryManager*    const   manager)
{
    XMLCh* orgText = replicate(tokenizeSrc, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);
    XMLCh* tokenizeStr = orgText;

    RefArrayVectorOf<XMLCh>* tokenStack = new (manager) RefArrayVectorOf<XMLCh>(16, true, manager);

    XMLSize_t len = stringLen(tokenizeStr);
    XMLSize_t skip;
    XMLSize_t index = 0;

    while (index != len) {
        // find the first non-space character
        for (skip = index; skip < len; skip++)
        {
            if (!XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }
        index = skip;

        // find the delimiter (space character)
        for (; skip < len; skip++)
        {
            if (XMLChar1_0::isWhitespace(tokenizeStr[skip]))
                break;
        }

        // we reached the end of the string
        if (skip == index)
            break;

        // these tokens are adopted in the RefVector and will be deleted
        // when the vector is deleted by the caller
        XMLCh* token = (XMLCh*) manager->allocate
        (
            (skip+1-index) * sizeof(XMLCh)
        );//new XMLCh[skip+1-index];

        XMLString::subString(token, tokenizeStr, index, skip, len, manager);
        tokenStack->addElement(token);
        index = skip;
    }
    return tokenStack;
}